

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_decoding.cc
# Opt level: O1

bool draco::DecodeTaggedSymbols<draco::RAnsSymbolDecoder>
               (uint32_t num_values,int num_components,DecoderBuffer *src_buffer,
               uint32_t *out_values)

{
  bool bVar1;
  bool bVar2;
  uint32_t nbits;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint32_t val;
  RAnsSymbolDecoder<5> tag_decoder;
  uint32_t local_a4;
  uint32_t *local_a0;
  RAnsSymbolDecoder<5> local_98;
  
  local_98.ans_.ans_.buf = (uint8_t *)0x0;
  local_98.ans_.ans_.buf_offset = 0;
  local_98.ans_.ans_.state = 0;
  local_98.ans_.probability_table_.
  super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.ans_.probability_table_.
  super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.ans_.lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.ans_.probability_table_.
  super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.ans_.lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.ans_.lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_98.num_symbols_ = 0;
  local_a0 = out_values;
  bVar1 = RAnsSymbolDecoder<5>::Create(&local_98,src_buffer);
  if (((bVar1) && (bVar1 = RAnsSymbolDecoder<5>::StartDecoding(&local_98,src_buffer), bVar1)) &&
     ((num_values == 0 || (local_98.num_symbols_ != 0)))) {
    DecoderBuffer::StartBitDecoding(src_buffer,false,(uint64_t *)0x0);
    bVar1 = num_values == 0;
    if (!bVar1) {
      uVar6 = 0;
      iVar5 = 0;
      do {
        nbits = RAnsSymbolDecoder<5>::DecodeSymbol(&local_98);
        bVar1 = 0 < num_components;
        if (0 < num_components) {
          iVar4 = 1;
          do {
            bVar2 = DecoderBuffer::DecodeLeastSignificantBits32(src_buffer,nbits,&local_a4);
            if (!bVar2) break;
            lVar3 = (long)iVar5;
            iVar5 = iVar5 + 1;
            local_a0[lVar3] = local_a4;
            bVar1 = iVar4 < num_components;
            bVar2 = iVar4 != num_components;
            iVar4 = iVar4 + 1;
          } while (bVar2);
        }
        if (bVar1) goto LAB_00180b8f;
        uVar6 = uVar6 + num_components;
        bVar1 = uVar6 >= num_values;
      } while (uVar6 < num_values);
    }
    DecoderBuffer::EndBitDecoding(src_buffer);
  }
  else {
LAB_00180b8f:
    bVar1 = false;
  }
  if (local_98.ans_.probability_table_.
      super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.ans_.probability_table_.
                    super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.ans_.probability_table_.
                          super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.ans_.probability_table_.
                          super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.ans_.lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.ans_.lut_table_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.ans_.lut_table_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.ans_.lut_table_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.probability_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.probability_table_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_98.probability_table_.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_98.probability_table_.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_98.probability_table_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool DecodeTaggedSymbols(uint32_t num_values, int num_components,
                         DecoderBuffer *src_buffer, uint32_t *out_values) {
  // Decode the encoded data.
  SymbolDecoderT<5> tag_decoder;
  if (!tag_decoder.Create(src_buffer)) {
    return false;
  }

  if (!tag_decoder.StartDecoding(src_buffer)) {
    return false;
  }

  if (num_values > 0 && tag_decoder.num_symbols() == 0) {
    return false;  // Wrong number of symbols.
  }

  // src_buffer now points behind the encoded tag data (to the place where the
  // values are encoded).
  src_buffer->StartBitDecoding(false, nullptr);
  int value_id = 0;
  for (uint32_t i = 0; i < num_values; i += num_components) {
    // Decode the tag.
    const uint32_t bit_length = tag_decoder.DecodeSymbol();
    // Decode the actual value.
    for (int j = 0; j < num_components; ++j) {
      uint32_t val;
      if (!src_buffer->DecodeLeastSignificantBits32(bit_length, &val)) {
        return false;
      }
      out_values[value_id++] = val;
    }
  }
  tag_decoder.EndDecoding();
  src_buffer->EndBitDecoding();
  return true;
}